

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void bitset_shift_left(bitset_t *bitset,size_t s)

{
  size_t sVar1;
  uint64_t *puVar2;
  byte bVar3;
  byte bVar4;
  uint64_t *puVar5;
  ulong uVar6;
  size_t i;
  ulong newarraysize;
  
  uVar6 = s >> 6;
  sVar1 = bitset->arraysize;
  newarraysize = uVar6 + sVar1;
  bVar3 = (byte)s & 0x3f;
  if ((s & 0x3f) == 0) {
    bitset_resize(bitset,newarraysize,false);
    if (uVar6 < newarraysize) {
      puVar2 = bitset->array;
      puVar5 = puVar2 + sVar1;
      do {
        puVar5 = puVar5 + -1;
        puVar2[newarraysize - 1] = *puVar5;
        newarraysize = newarraysize - 1;
      } while (uVar6 < newarraysize);
    }
  }
  else {
    bitset_resize(bitset,newarraysize + 1,true);
    puVar5 = bitset->array;
    puVar5[newarraysize] = puVar5[sVar1 - 1] >> (-bVar3 & 0x3f);
    bVar4 = (byte)s & 0x3f;
    if (uVar6 + 2 <= newarraysize) {
      puVar2 = puVar5 + sVar1;
      do {
        puVar5[newarraysize - 1] = puVar2[-2] >> (0x40 - bVar3 & 0x3f) | puVar2[-1] << bVar4;
        newarraysize = newarraysize - 1;
        puVar2 = puVar2 + -1;
      } while (uVar6 + 2 <= newarraysize);
    }
    puVar5[uVar6] = *puVar5 << bVar4;
  }
  if (s < 0x40) {
    return;
  }
  memset(bitset->array,0,uVar6 << 3);
  return;
}

Assistant:

void bitset_shift_left(bitset_t *bitset, size_t s) {
    size_t extra_words = s / 64;
    int inword_shift = s % 64;
    size_t as = bitset->arraysize;
    if (inword_shift == 0) {
        bitset_resize(bitset, as + extra_words, false);
        // could be done with a memmove
        for (size_t i = as + extra_words; i > extra_words; i--) {
            bitset->array[i - 1] = bitset->array[i - 1 - extra_words];
        }
    } else {
        bitset_resize(bitset, as + extra_words + 1, true);
        bitset->array[as + extra_words] =
            bitset->array[as - 1] >> (64 - inword_shift);
        for (size_t i = as + extra_words; i >= extra_words + 2; i--) {
            bitset->array[i - 1] =
                (bitset->array[i - 1 - extra_words] << inword_shift) |
                (bitset->array[i - 2 - extra_words] >> (64 - inword_shift));
        }
        bitset->array[extra_words] = bitset->array[0] << inword_shift;
    }
    for (size_t i = 0; i < extra_words; i++) {
        bitset->array[i] = 0;
    }
}